

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleDictionaryTypeHandler.cpp
# Opt level: O0

bool __thiscall
Js::SimpleDictionaryTypeHandlerBase<int,_const_Js::PropertyRecord_*,_false>::
GetPropertyEquivalenceInfo
          (SimpleDictionaryTypeHandlerBase<int,_const_Js::PropertyRecord_*,_false> *this,
          PropertyRecord *propertyRecord,PropertyEquivalenceInfo *info)

{
  bool bVar1;
  PropertyIndex slotIndex;
  PropertyIndex PVar2;
  uint16 uVar3;
  BaseDictionary<const_Js::PropertyRecord_*,_Js::SimpleDictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<const_Js::PropertyRecord_*>::Entry,_JsUtil::NoResizeLock>
  *this_00;
  SimpleDictionaryPropertyDescriptor<int> *pSStack_28;
  PropertyIndex absSlotIndex;
  SimpleDictionaryPropertyDescriptor<int> *descriptor;
  PropertyEquivalenceInfo *info_local;
  PropertyRecord *propertyRecord_local;
  SimpleDictionaryTypeHandlerBase<int,_const_Js::PropertyRecord_*,_false> *this_local;
  
  descriptor = (SimpleDictionaryPropertyDescriptor<int> *)info;
  info_local = (PropertyEquivalenceInfo *)propertyRecord;
  propertyRecord_local = (PropertyRecord *)this;
  this_00 = Memory::
            WriteBarrierPtr<JsUtil::BaseDictionary<const_Js::PropertyRecord_*,_Js::SimpleDictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<const_Js::PropertyRecord_*>::Entry,_JsUtil::NoResizeLock>_>
            ::operator->(&this->propertyMap);
  bVar1 = JsUtil::
          BaseDictionary<Js::PropertyRecord_const*,Js::SimpleDictionaryPropertyDescriptor<int>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,Js::PropertyMapKeyTraits<Js::PropertyRecord_const*>::Entry,JsUtil::NoResizeLock>
          ::TryGetReference<Js::PropertyRecord_const*>
                    ((BaseDictionary<Js::PropertyRecord_const*,Js::SimpleDictionaryPropertyDescriptor<int>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,Js::PropertyMapKeyTraits<Js::PropertyRecord_const*>::Entry,JsUtil::NoResizeLock>
                      *)this_00,(PropertyRecord **)&info_local,&stack0xffffffffffffffd8);
  if ((bVar1) && ((pSStack_28->Attributes & 8) == 0)) {
    slotIndex = DisallowBigPropertyIndex<int>(pSStack_28->propertyIndex);
    PVar2 = DynamicTypeHandler::AdjustSlotIndexForInlineSlots
                      (&this->super_DynamicTypeHandler,slotIndex);
    *(PropertyIndex *)descriptor = PVar2;
    uVar3 = DynamicTypeHandler::GetInlineSlotCapacity(&this->super_DynamicTypeHandler);
    descriptor->field_0x2 = uVar3 < slotIndex;
    descriptor->field_0x3 = (pSStack_28->Attributes & 4) != 0;
  }
  else {
    *(undefined2 *)descriptor = 0xffff;
    descriptor->field_0x2 = 0;
    descriptor->field_0x3 = 0;
  }
  return *(short *)descriptor != -1;
}

Assistant:

bool SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported>::GetPropertyEquivalenceInfo(PropertyRecord const* propertyRecord, PropertyEquivalenceInfo& info)
    {
        SimpleDictionaryPropertyDescriptor<TPropertyIndex>* descriptor;
        if (propertyMap->TryGetReference(propertyRecord, &descriptor) && !(descriptor->Attributes & PropertyDeleted))
        {
            Js::PropertyIndex absSlotIndex = DisallowBigPropertyIndex(descriptor->propertyIndex);
            info.slotIndex = AdjustSlotIndexForInlineSlots(absSlotIndex);
            info.isAuxSlot = absSlotIndex > GetInlineSlotCapacity();
            info.isWritable = !!(descriptor->Attributes & PropertyWritable);
        }
        else
        {
            info.slotIndex = Constants::NoSlot;
            info.isAuxSlot = false;
            info.isWritable = false;
        }
        return info.slotIndex != Constants::NoSlot;
    }